

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# X3DImporter_Postprocess.cpp
# Opt level: O3

bool __thiscall Assimp::X3DImporter::PostprocessHelper_ElementIsMesh(X3DImporter *this,EType pType)

{
  int iVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  
  auVar2._0_4_ = -(uint)(pType == ENET_LineSet);
  auVar2._4_4_ = -(uint)(pType == ENET_Sphere);
  auVar2._8_4_ = -(uint)(pType == ENET_TriangleSet2D);
  auVar2._12_4_ = -(uint)(pType == ENET_TriangleStripSet);
  auVar3._0_4_ = -(uint)((int)(pType - ENET_Arc2D ^ 0x80000000) < -0x7ffffffc);
  auVar3._4_4_ = -(uint)((int)(pType - ENET_Box ^ 0x80000000) < -0x7ffffffd);
  auVar3._8_4_ = -(uint)((int)(pType - ENET_ElevationGrid ^ 0x80000000) < -0x7ffffffe);
  auVar3._12_4_ = -(uint)((int)(pType - ENET_Polyline2D ^ 0x80000000) < -0x7ffffffd);
  iVar1 = movmskps(pType - ENET_TriangleSet,auVar3 | auVar2);
  return ((pType - ENET_TriangleSet < 2 ||
          (pType & ~ENET_MetaDouble) == ENET_IndexedTriangleStripSet) ||
         (pType & ~ENET_MetaFloat) == ENET_IndexedFaceSet) || iVar1 != 0;
}

Assistant:

bool X3DImporter::PostprocessHelper_ElementIsMesh(const CX3DImporter_NodeElement::EType pType) const
{
	if((pType == CX3DImporter_NodeElement::ENET_Arc2D) || (pType == CX3DImporter_NodeElement::ENET_ArcClose2D) ||
		(pType == CX3DImporter_NodeElement::ENET_Box) || (pType == CX3DImporter_NodeElement::ENET_Circle2D) ||
		(pType == CX3DImporter_NodeElement::ENET_Cone) || (pType == CX3DImporter_NodeElement::ENET_Cylinder) ||
		(pType == CX3DImporter_NodeElement::ENET_Disk2D) || (pType == CX3DImporter_NodeElement::ENET_ElevationGrid) ||
		(pType == CX3DImporter_NodeElement::ENET_Extrusion) || (pType == CX3DImporter_NodeElement::ENET_IndexedFaceSet) ||
		(pType == CX3DImporter_NodeElement::ENET_IndexedLineSet) || (pType == CX3DImporter_NodeElement::ENET_IndexedTriangleFanSet) ||
		(pType == CX3DImporter_NodeElement::ENET_IndexedTriangleSet) || (pType == CX3DImporter_NodeElement::ENET_IndexedTriangleStripSet) ||
		(pType == CX3DImporter_NodeElement::ENET_PointSet) || (pType == CX3DImporter_NodeElement::ENET_LineSet) ||
		(pType == CX3DImporter_NodeElement::ENET_Polyline2D) || (pType == CX3DImporter_NodeElement::ENET_Polypoint2D) ||
		(pType == CX3DImporter_NodeElement::ENET_Rectangle2D) || (pType == CX3DImporter_NodeElement::ENET_Sphere) ||
		(pType == CX3DImporter_NodeElement::ENET_TriangleFanSet) || (pType == CX3DImporter_NodeElement::ENET_TriangleSet) ||
		(pType == CX3DImporter_NodeElement::ENET_TriangleSet2D) || (pType == CX3DImporter_NodeElement::ENET_TriangleStripSet))
	{
		return true;
	}
	else
	{
		return false;
	}
}